

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-accel.c
# Opt level: O3

int fy_accel_remove(fy_accel *xl,void *data)

{
  int iVar1;
  fy_accel_entry *xle;
  
  xle = fy_accel_entry_lookup(xl,data);
  if (xle == (fy_accel_entry *)0x0) {
    iVar1 = -1;
  }
  else {
    fy_accel_entry_remove(xl,xle);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
fy_accel_remove(struct fy_accel *xl, const void *data) {
    struct fy_accel_entry *xle;

    xle = fy_accel_entry_lookup(xl, data);
    if (!xle)
        return -1;

    fy_accel_entry_remove(xl, xle);

    return 0;
}